

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O2

int ndn_signature_info_tlv_decode(ndn_decoder_t *decoder,ndn_signature_t *signature)

{
  uint32_t uVar1;
  uint64_t *value;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t value_length;
  uint32_t probe;
  
  signature->enable_KeyLocator = '\0';
  signature->enable_ValidityPeriod = '\0';
  signature->is_interest = false;
  signature->enable_SignatureNonce = '\0';
  signature->signature_nonce = 0;
  signature->enable_Timestamp = '\0';
  signature->timestamp = 0;
  signature->enable_Seqnum = '\0';
  signature->seqnum = 0;
  local_34 = 0;
  iVar3 = decoder_get_var(decoder,&local_34);
  if (iVar3 == 0) {
    if (local_34 == 0x16) {
      _Var2 = false;
    }
    else {
      if (local_34 != 0x2c) {
        return -0xc;
      }
      _Var2 = true;
    }
    signature->is_interest = _Var2;
    local_38 = 0;
    iVar3 = decoder_get_var(decoder,&local_38);
    if (iVar3 == 0) {
      uVar1 = decoder->offset;
      iVar3 = decoder_get_var(decoder,&local_34);
      if (((iVar3 == 0) && (iVar3 = decoder_get_var(decoder,&local_34), iVar3 == 0)) &&
         (iVar3 = decoder_get_byte_value(decoder,&signature->sig_type), iVar3 == 0)) {
        uVar4 = uVar1 + local_38;
        do {
          if (uVar4 <= decoder->offset) {
            return 0;
          }
          iVar3 = decoder_get_var(decoder,&local_34);
          if (iVar3 != 0) {
            return iVar3;
          }
          if (local_34 == 10) {
            signature->enable_SignatureNonce = '\x01';
            iVar3 = decoder_get_var(decoder,&local_34);
            if (iVar3 != 0) {
              return iVar3;
            }
            if (local_34 != 4) {
              return -0xd;
            }
            iVar3 = decoder_get_uint32_value(decoder,&signature->signature_nonce);
          }
          else if (local_34 == 0xfd) {
            signature->enable_ValidityPeriod = '\x01';
            iVar3 = decoder_get_var(decoder,&local_34);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = decoder_get_var(decoder,&local_34);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = decoder_get_var(decoder,&local_34);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = decoder_get_raw_buffer_value
                              (decoder,(signature->validity_period).not_before,0xf);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = decoder_get_var(decoder,&local_34);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = decoder_get_var(decoder,&local_34);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = decoder_get_raw_buffer_value(decoder,(signature->validity_period).not_after,0xf)
            ;
          }
          else {
            if (local_34 == 0x28) {
              signature->enable_Timestamp = '\x01';
              iVar3 = decoder_get_var(decoder,&local_34);
              value = &signature->timestamp;
            }
            else {
              if (local_34 != 0x2a) {
                if (local_34 != 0x1c) {
                  return -0xc;
                }
                signature->enable_KeyLocator = '\x01';
                iVar3 = decoder_get_var(decoder,&local_34);
                if (iVar3 != 0) {
                  return iVar3;
                }
                iVar3 = ndn_name_tlv_decode(decoder,&signature->key_locator_name);
                goto LAB_0010b040;
              }
              signature->enable_Seqnum = '\x01';
              iVar3 = decoder_get_var(decoder,&local_34);
              value = &signature->seqnum;
            }
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = decoder_get_uint_value(decoder,local_34,value);
          }
LAB_0010b040:
        } while (iVar3 == 0);
      }
    }
  }
  return iVar3;
}

Assistant:

int
ndn_signature_info_tlv_decode(ndn_decoder_t* decoder, ndn_signature_t* signature)
{
  int ret_val = -1;
  ndn_signature_init(signature, false);

  uint32_t probe = 0;
  ret_val = decoder_get_type(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  if (probe == TLV_SignatureInfo) {
    signature->is_interest = false;
  }
  else if (probe == TLV_InterestSignatureInfo) {
    signature->is_interest = true;
  }
  else {
    return NDN_WRONG_TLV_TYPE;
  }
  uint32_t value_length = 0;
  ret_val = decoder_get_length(decoder, &value_length);
  if (ret_val != NDN_SUCCESS) return ret_val;
  uint32_t value_starting = decoder->offset;

  // signature type
  ret_val = decoder_get_type(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = decoder_get_length(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = decoder_get_byte_value(decoder, &signature->sig_type);
  if (ret_val != NDN_SUCCESS) return ret_val;

  while (decoder->offset < value_starting + value_length) {
    ret_val = decoder_get_type(decoder, &probe);
    if (ret_val != NDN_SUCCESS) return ret_val;
    if (probe == TLV_KeyLocator) {
      signature->enable_KeyLocator = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = ndn_name_tlv_decode(decoder, &signature->key_locator_name);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_ValidityPeriod) {
      signature->enable_ValidityPeriod = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;

      ret_val = decoder_get_type(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_raw_buffer_value(decoder, signature->validity_period.not_before, 15);
      if (ret_val != NDN_SUCCESS) return ret_val;

      ret_val = decoder_get_type(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_raw_buffer_value(decoder, signature->validity_period.not_after, 15);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_Nonce) {
      signature->enable_SignatureNonce = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      if (probe != 4) {
        return NDN_WRONG_TLV_LENGTH;
      }
      ret_val = decoder_get_uint32_value(decoder, &signature->signature_nonce);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_Timestamp) {
      signature->enable_Timestamp = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_uint_value(decoder, probe, &signature->timestamp);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_SeqNum) {
      signature->enable_Seqnum = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_uint_value(decoder, probe, &signature->seqnum);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else
      return NDN_WRONG_TLV_TYPE;
  }
  return 0;
}